

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>>::
MatchAndExplain<std::array<solitaire::cards::Card,52ul>>
          (ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>> *this,
          array<solitaire::cards::Card,_52UL> *lhs,MatchResultListener *listener)

{
  Card *rhs;
  ostream *os;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  bVar1 = solitaire::cards::operator==(lhs->_M_elems,(Card *)this);
  if (bVar1) {
    lVar5 = 8;
    do {
      bVar1 = lVar5 == 0x1a0;
      if (bVar1) goto LAB_001af009;
      bVar1 = solitaire::cards::operator==
                        ((Card *)((long)&lhs->_M_elems[0].value + lVar5),(Card *)(this + lVar5));
      lVar5 = lVar5 + 8;
    } while (bVar1);
  }
  bVar1 = false;
LAB_001af009:
  if ((!bVar1) && (os = listener->stream_, os != (ostream *)0x0)) {
    lVar5 = 0;
    bVar3 = false;
    do {
      rhs = (Card *)((long)&lhs->_M_elems[0].value + lVar5);
      lVar6 = 0;
      do {
        bVar2 = solitaire::cards::operator==((Card *)(this + lVar6),rhs);
        if (bVar2) goto LAB_001af05a;
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x1a0);
      lVar6 = 0x1a0;
LAB_001af05a:
      if (lVar6 == 0x1a0) {
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,"which has these unexpected elements: ",0x25);
          bVar3 = true;
        }
        solitaire::cards::operator<<(os,rhs);
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x1a0);
    pcVar4 = "which";
    if (bVar3) {
      pcVar4 = ",\nand";
    }
    lVar5 = 0;
    bVar3 = false;
    do {
      lVar6 = 0;
      do {
        bVar2 = solitaire::cards::operator==
                          ((Card *)((long)&lhs->_M_elems[0].value + lVar6),(Card *)(this + lVar5));
        if (bVar2) goto LAB_001af10d;
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x1a0);
      lVar6 = 0x1a0;
LAB_001af10d:
      if (lVar6 == 0x1a0) {
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (os," doesn\'t have these expected elements: ",0x27);
          bVar3 = true;
        }
        solitaire::cards::operator<<(os,(Card *)(this + lVar5));
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x1a0);
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }